

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

Gia_Man_t * Gia_ManFromIfAig(If_Man_t *pIfMan)

{
  If_Cut_t *pCut;
  If_Par_t *pIVar1;
  uint *puVar2;
  Gia_Obj_t *pGVar3;
  void *pvVar4;
  uint uVar5;
  Gia_Man_t *p;
  Vec_Int_t *vAig;
  int *piVar6;
  Vec_Int_t *p_00;
  Vec_Ptr_t *pVVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  long lVar10;
  ulong uVar11;
  
  pIVar1 = pIfMan->pPars;
  if (pIVar1->pLutStruct != (char *)0x0) {
    __assert_fail("pIfMan->pPars->pLutStruct == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,0x382,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  if (((pIVar1->fDelayOpt == 0) && (pIVar1->fDsdBalance == 0)) && (pIVar1->fUserRecLib == 0)) {
    __assert_fail("pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,899,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  p = Gia_ManStart(pIfMan->vObjs->nSize);
  Gia_ManHashAlloc(p);
  vAig = (Vec_Int_t *)malloc(0x10);
  vAig->nCap = 0x10000;
  vAig->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vAig->pArray = piVar6;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_00->pArray = piVar6;
  pVVar7 = pIfMan->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      puVar2 = (uint *)pVVar7->pArray[lVar10];
      if ((puVar2[3] != 0) || ((*puVar2 & 0xe) == 2)) {
        uVar5 = *puVar2 & 0xf;
        switch(uVar5) {
        case 1:
          break;
        case 2:
          pGVar8 = Gia_ManAppendObj(p);
          uVar11 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
          *(ulong *)pGVar8 =
               uVar11 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar3 = p->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p->nObjs <= pGVar8)) {
LAB_006b72dd:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p->nObjs <= pGVar8)) goto LAB_006b72dd;
          uVar5 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
          break;
        case 3:
          if ((int)*(uint *)(*(long *)(puVar2 + 6) + 0x40) < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          uVar5 = Gia_ManAppendCo(p,*(uint *)(*(long *)(puVar2 + 6) + 0x40) ^ *puVar2 >> 4 & 1);
          break;
        case 4:
          p_00->nSize = 0;
          if (0xffffff < puVar2[0x1b]) {
            uVar11 = 0;
            do {
              uVar5 = puVar2[uVar11 + 0x1c];
              if (((long)(int)uVar5 < 0) || (pIfMan->vObjs->nSize <= (int)uVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar4 = pIfMan->vObjs->pArray[(int)uVar5];
              if (pvVar4 == (void *)0x0) break;
              Vec_IntPush(p_00,*(int *)((long)pvVar4 + 0x40));
              uVar11 = uVar11 + 1;
            } while (uVar11 < *(byte *)((long)puVar2 + 0x6f));
          }
          pCut = (If_Cut_t *)(puVar2 + 0x14);
          pIVar1 = pIfMan->pPars;
          if (pIVar1->fDelayOpt == 0) {
            if (pIVar1->fDsdBalance == 0) {
              if (pIVar1->fUserRecLib == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                              ,0x3a4,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
              }
              uVar5 = Abc_RecToGia3(p,pIfMan,pCut,p_00,0);
              break;
            }
            If_CutDsdBalanceEval(pIfMan,pCut,vAig);
          }
          else {
            If_CutSopBalanceEval(pIfMan,pCut,vAig);
          }
          uVar5 = Gia_ManBuildFromMiniInt(p,p_00,vAig,0);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x3ac,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
        }
        puVar2[0x10] = uVar5;
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pIfMan->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  if (vAig->pArray != (int *)0x0) {
    free(vAig->pArray);
    vAig->pArray = (int *)0x0;
  }
  free(vAig);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pGVar9 = Gia_ManRehash(p,0);
  Gia_ManStop(p);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManFromIfAig( If_Man_t * pIfMan )
{
    int fHash = 0;
    Gia_Man_t * pNew, * pTemp;
    If_Obj_t * pIfObj, * pIfLeaf;
    If_Cut_t * pCutBest;
    Vec_Int_t * vLeaves;
    Vec_Int_t * vAig;
    int i, k;
    assert( pIfMan->pPars->pLutStruct == NULL );
    assert( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib );
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    Gia_ManHashAlloc( pNew );
    // iterate through nodes used in the mapping
    vAig = Vec_IntAlloc( 1 << 16 );
    vLeaves = Vec_IntAlloc( 16 );
//    If_ManForEachObj( pIfMan, pIfObj, i )
//        pIfObj->iCopy = 0;
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // if the cut does not offer delay improvement
//            if ( (int)pIfObj->Level <= (int)pCutBest->Delay )
//            {
//                Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj );
//                continue;
//            }
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // get the functionality
            if ( pIfMan->pPars->fDelayOpt )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 0 );
            else if ( pIfMan->pPars->fDsdBalance )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 1 );
            else if ( pIfMan->pPars->fUserRecLib )
                pIfObj->iCopy = Abc_RecToGia3( pNew, pIfMan, pCutBest, vLeaves, fHash );
            else assert( 0 );
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
            pIfObj->iCopy = 1;
        else assert( 0 );
    }
    Vec_IntFree( vAig );
    Vec_IntFree( vLeaves );
    pNew = Gia_ManRehash( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}